

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PInt::PInt(PInt *this)

{
  DObject *pDVar1;
  
  PType::PType((PType *)this,4,4);
  *(undefined ***)this = &PTR_StaticType_00846640;
  this->Unsigned = false;
  pDVar1 = (DObject *)
           M_Malloc_Dbg(0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
  DObject::DObject(pDVar1);
  *(undefined4 *)&pDVar1->field_0x24 = 0x23a;
  pDVar1[1]._vptr_DObject = (_func_int **)this;
  pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
  *(undefined4 *)&pDVar1[1].Class = 0x80000000;
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  pDVar1 = (DObject *)
           M_Malloc_Dbg(0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
  DObject::DObject(pDVar1);
  *(undefined4 *)&pDVar1->field_0x24 = 0x23b;
  pDVar1[1]._vptr_DObject = (_func_int **)this;
  pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
  *(undefined4 *)&pDVar1[1].Class = 0x7fffffff;
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  return;
}

Assistant:

PInt::PInt()
: PBasicType(4, 4), Unsigned(false)
{
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, -0x7FFFFFFF - 1));
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this,  0x7FFFFFFF));
}